

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall
irr::video::COpenGL3DriverBase::setClipPlane
          (COpenGL3DriverBase *this,u32 index,plane3df *plane,bool enable)

{
  array<irr::video::COpenGL3DriverBase::SUserClipPlane> *this_00;
  undefined8 uVar1;
  pointer pSVar2;
  SUserClipPlane local_48;
  
  this_00 = &this->UserClipPlane;
  pSVar2 = (this->UserClipPlane).m_data.
           super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uint)(((long)(this->UserClipPlane).m_data.
                    super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x14) <= index) {
    local_48.Plane.Normal.X = 0.0;
    local_48.Plane.Normal.Y = 0.0;
    local_48.Plane.Normal.Z = 0.0;
    local_48.Plane.D = 0.0;
    local_48.Enabled = false;
    local_48._17_3_ = 0;
    core::plane3d<float>::plane3d(&local_48.Plane);
    core::array<irr::video::COpenGL3DriverBase::SUserClipPlane>::push_back(this_00,&local_48);
    pSVar2 = (this_00->m_data).
             super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar1 = *(undefined8 *)&(plane->Normal).Z;
  *(undefined8 *)&pSVar2[index].Plane.Normal = *(undefined8 *)&plane->Normal;
  *(undefined8 *)((long)&pSVar2[index].Plane.Normal + 8) = uVar1;
  (this_00->m_data).
  super__Vector_base<irr::video::COpenGL3DriverBase::SUserClipPlane,_std::allocator<irr::video::COpenGL3DriverBase::SUserClipPlane>_>
  ._M_impl.super__Vector_impl_data._M_start[index].Enabled = enable;
  return true;
}

Assistant:

bool COpenGL3DriverBase::setClipPlane(u32 index, const core::plane3df &plane, bool enable)
{
	if (index >= UserClipPlane.size())
		UserClipPlane.push_back(SUserClipPlane());

	UserClipPlane[index].Plane = plane;
	UserClipPlane[index].Enabled = enable;
	return true;
}